

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O1

String * capnp::_::enumString
                   (String *__return_storage_ptr__,uint16_t value,RawBrandedSchema *schema)

{
  uint16_t uVar1;
  unsigned_short *params;
  Reader RVar2;
  EnumerantList enumerants;
  uint16_t local_ba;
  Schema local_b8;
  ushort local_b0;
  StructReader local_a8;
  PointerReader local_78;
  EnumerantList local_58;
  
  local_ba = value;
  local_78.segment = (SegmentReader *)schema;
  local_b8.raw = (RawBrandedSchema *)Schema::asEnum((Schema *)&local_78);
  EnumSchema::getEnumerants(&local_58,(EnumSchema *)&local_b8);
  uVar1 = local_ba;
  if (local_ba < local_58.list.reader.elementCount) {
    ListReader::getStructElement(&local_a8,&local_58.list.reader,(uint)local_ba);
    local_b8 = local_58.parent.super_Schema.raw;
    local_b0 = uVar1;
    if (local_a8.pointerCount == 0) {
      local_a8.nestingLimit = 0x7fffffff;
      local_a8.capTable = (CapTableReader *)0x0;
      local_a8.pointers = (WirePointer *)0x0;
      local_a8.segment = (SegmentReader *)0x0;
    }
    local_78.segment = local_a8.segment;
    local_78.capTable = local_a8.capTable;
    local_78.pointer = local_a8.pointers;
    local_78.nestingLimit = local_a8.nestingLimit;
    RVar2 = PointerReader::getBlob<capnp::Text>(&local_78,(void *)0x0,0);
    kj::heapString(__return_storage_ptr__,RVar2.super_StringPtr.content.ptr,
                   RVar2.super_StringPtr.content.size_ - 1);
  }
  else {
    kj::str<unsigned_short&>(__return_storage_ptr__,(kj *)&local_ba,params);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::String enumString(uint16_t value, const RawBrandedSchema& schema) {
  auto enumerants = Schema(&schema).asEnum().getEnumerants();
  if (value < enumerants.size()) {
    return kj::heapString(enumerants[value].getProto().getName());
  } else {
    return kj::str(value);
  }
}